

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall tokenizer::read_identifier(tokenizer *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  tokenizer *this_local;
  
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  while ((*this->line_char != '\0' &&
         ((iVar2 = isalnum((int)*this->line_char), iVar2 != 0 || (*this->line_char == '_'))))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (&this->current_word,*this->line_char);
    this->line_char = this->line_char + 1;
  }
  bVar1 = read_keyword_if_any(this);
  if (!bVar1) {
    add_token_to_stream(this,identifier);
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (&this->current_word);
  this->position_number = this->position_number + (int)sVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->current_word,"");
  return;
}

Assistant:

void tokenizer::read_identifier() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isalnum(*line_char) || *line_char == '_') {
            current_word += *line_char;
            line_char++;
        }
        else {
            break;
        }
    }

    if(!this->read_keyword_if_any()){
        this->add_token_to_stream(Token_Type::identifier);
    }

    position_number += current_word.length();
    current_word = "";
}